

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

void __thiscall SQFuncState::AddParameter(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  ulong uVar3;
  SQUnsignedInteger SVar4;
  SQObjectPtr *pSVar5;
  SQUnsignedInteger SVar6;
  SQObjectPtr local_20;
  
  PushLocalVariable(this,name);
  local_20.super_SQObject._type = name->_type;
  local_20.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  uVar2 = (this->_parameters)._size;
  uVar3 = (this->_parameters)._allocated;
  if (uVar3 <= uVar2) {
    SVar4 = uVar2 * 2;
    SVar6 = 4;
    if (SVar4 != 0) {
      SVar6 = SVar4;
    }
    pSVar5 = (SQObjectPtr *)sq_vm_realloc((this->_parameters)._vals,uVar3 << 4,SVar6 << 4);
    (this->_parameters)._vals = pSVar5;
    (this->_parameters)._allocated = SVar6;
  }
  pSVar5 = (this->_parameters)._vals;
  SVar4 = (this->_parameters)._size;
  (this->_parameters)._size = SVar4 + 1;
  pSVar5[SVar4].super_SQObject._type = local_20.super_SQObject._type;
  pSVar5[SVar4].super_SQObject._unVal.pTable = (SQTable *)local_20.super_SQObject._unVal;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar5[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return;
}

Assistant:

void SQFuncState::AddParameter(const SQObject &name)
{
    PushLocalVariable(name);
    _parameters.push_back(name);
}